

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O0

void __thiscall xray_re::se_stalker::state_read(se_stalker *this,xr_packet *packet,uint16_t size)

{
  uint16_t size_local;
  xr_packet *packet_local;
  se_stalker *this_local;
  
  cse_alife_human_stalker::state_read(&this->super_cse_alife_human_stalker,packet,size);
  if (*(ushort *)
       &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
        super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28 < 0x80) {
    if (*(ushort *)
         &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
          super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28 < 0x7a) {
      if (*(short *)&(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                     super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28
          == 0x76) {
        if ((2 < *(ushort *)
                  &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                   super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) &&
           (xr_packet::r_u8(packet,&this->m_job_online), 2 < this->m_job_online)) {
          xr_packet::skip_sz(packet);
        }
        if (4 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_bool(packet,&this->m_was_in_smart_terrain);
        }
        if (5 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_bool(packet,&this->m_death_dropped);
        }
      }
      else if (*(short *)&(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                          super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.
                          field_0x28 == 0x68) {
        if (2 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_u8(packet,&this->m_job_online);
        }
      }
      else if (*(short *)&(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                          super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.
                          field_0x28 == 0x75) {
        if (2 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_u8(packet,&this->m_job_online);
        }
      }
      else {
        if (*(short *)&(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                       super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28
            != 0x65) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                        ,0x176,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)"
                       );
        }
        if (1 < *(ushort *)
                 &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                  super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
          xr_packet::r_bool(packet,&this->m_was_in_smart_terrain);
        }
      }
    }
    else {
      if (0x7c < *(ushort *)
                  &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                   super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28) {
        __assert_fail("m_version <= CSE_VERSION_CS",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                      ,0x158,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)");
      }
      xr_packet::r_u8(packet,&this->m_job_online);
      if (2 < this->m_job_online) {
        xr_packet::skip_sz(packet);
      }
      xr_packet::r_bool(packet,&this->m_death_dropped);
      if (6 < *(ushort *)
               &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
        xr_packet::r_sz(packet,&this->m_squad_id);
      }
      if (7 < *(ushort *)
               &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x2a) {
        xr_packet::r_bool(packet,&this->m_sim_forced_online);
      }
    }
  }
  else {
    if (0x80 < *(ushort *)
                &(this->super_cse_alife_human_stalker).super_cse_alife_human_abstract.
                 super_cse_alife_monster_abstract.super_cse_alife_creature_abstract.field_0x28) {
      __assert_fail("m_version <= CSE_VERSION_COP",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                    ,0x152,"virtual void xray_re::se_stalker::state_read(xr_packet &, uint16_t)");
    }
    xr_packet::r_sz(packet,&this->m_old_lvid);
    xr_packet::r_sz(packet,&this->m_active_section);
    xr_packet::r_bool(packet,&this->m_death_dropped);
  }
  return;
}

Assistant:

void se_stalker::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_human_stalker::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		xr_assert(m_version <= CSE_VERSION_COP);
		packet.r_sz(m_old_lvid);
		packet.r_sz(m_active_section);
		packet.r_bool(m_death_dropped);
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);
		packet.r_u8(m_job_online);
		if (m_job_online > 2)
			packet.skip_sz();
		packet.r_bool(m_death_dropped);
		if (m_script_version >= 7)
			packet.r_sz(m_squad_id);
		if (m_script_version >= 8)
			packet.r_bool(m_sim_forced_online);
	} else if (m_version == CSE_VERSION_SOC) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
			if (m_job_online > 2)
				packet.skip_sz();
		}
		if (m_script_version >= 5)
			packet.r_bool(m_was_in_smart_terrain);
		if (m_script_version >= 6)
			packet.r_bool(m_death_dropped);
	} else if (m_version == CSE_VERSION_2232) {
		if (m_script_version >= 3)
			packet.r_u8(m_job_online);
	} else if (m_version == CSE_VERSION_2571) {
		if (m_script_version >= 3) {
			packet.r_u8(m_job_online);
		}	
	} else if (m_version == CSE_VERSION_2215) {
		if (m_script_version >= 2)
			packet.r_bool(m_was_in_smart_terrain);
	} else {
		xr_not_implemented();
	}
}